

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

uchar __thiscall ieee754::mantissa_msb_mask(ieee754 *this)

{
  ieee754 *this_local;
  uchar local_1;
  
  if (this->ebits < 8) {
    local_1 = (uchar)(0x7f >> ((byte)this->ebits & 0x1f));
  }
  else if (this->ebits < 0x10) {
    local_1 = (uchar)(0xff >> ((char)this->ebits - 7U & 0x1f));
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

unsigned char mantissa_msb_mask() const
    {
        if (ebits <= 7)
            return (0x7f >> ebits);
        else if (ebits <= 15)
            return (0xff >> (ebits - 7));
        else
        {
            assert(FALSE);
            return 0;
        }
    }